

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O2

adios2_attribute *
adios2_define_variable_attribute_array
          (adios2_io *io,char *name,adios2_type type,void *data,size_t size,char *variable_name,
          char *separator)

{
  Attribute *pAVar1;
  invalid_argument *piVar2;
  string *this;
  allocator local_29a;
  allocator local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  allocator local_251;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arrayStrings;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70;
  string local_50;
  
  std::__cxx11::string::string
            ((string *)&local_50,"for adios2_io, in call to adios2_define_attribute",
             (allocator *)&local_298);
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string
            ((string *)&local_70,"for const void* data, in call to adios2_define_attribute",
             (allocator *)&local_298);
  adios2::helper::CheckForNullptr<void_const>(data,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if (size != 0) {
    switch(type) {
    case adios2_type_string:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<char_const**,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&arrayStrings,
                 (char **)data,(char **)((long)data + size * 8),(allocator_type *)&local_298);
      std::__cxx11::string::string((string *)&local_298,name,&local_29a);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_299);
      std::__cxx11::string::string(local_90,separator,&local_251);
      pAVar1 = adios2::core::IO::DefineAttribute<std::__cxx11::string>
                         (io,&local_298,
                          arrayStrings.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)arrayStrings.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)arrayStrings.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5,&local_278,local_90,0
                         );
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&arrayStrings);
      return (adios2_attribute *)pAVar1;
    case adios2_type_float:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_1b0,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<float>
                         (io,&local_298,data,size,&local_278,local_1b0,0);
      this = local_1b0;
      break;
    case adios2_type_double:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_1d0,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<double>
                         (io,&local_298,data,size,&local_278,local_1d0,0);
      this = local_1d0;
      break;
    case adios2_type_float_complex:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_210,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<std::complex<float>>
                         (io,&local_298,data,size,&local_278,local_210,0);
      this = local_210;
      break;
    case adios2_type_double_complex:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_230,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<std::complex<double>>
                         (io,&local_298,data,size,&local_278,local_230,0);
      this = local_230;
      break;
    case adios2_type_int8_t:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_b0,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<signed_char>
                         (io,&local_298,data,size,&local_278,local_b0,0);
      this = local_b0;
      break;
    case adios2_type_int16_t:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_d0,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<short>
                         (io,&local_298,data,size,&local_278,local_d0,0);
      this = local_d0;
      break;
    case adios2_type_int32_t:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_f0,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<int>(io,&local_298,data,size,&local_278,local_f0,0)
      ;
      this = local_f0;
      break;
    case adios2_type_int64_t:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_110,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<long>
                         (io,&local_298,data,size,&local_278,local_110,0);
      this = local_110;
      break;
    case adios2_type_uint8_t:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_130,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<unsigned_char>
                         (io,&local_298,data,size,&local_278,local_130,0);
      this = local_130;
      break;
    case adios2_type_uint16_t:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_150,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<unsigned_short>
                         (io,&local_298,data,size,&local_278,local_150,0);
      this = local_150;
      break;
    case adios2_type_uint32_t:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_170,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<unsigned_int>
                         (io,&local_298,data,size,&local_278,local_170,0);
      this = local_170;
      break;
    case adios2_type_uint64_t:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_190,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<unsigned_long>
                         (io,&local_298,data,size,&local_278,local_190,0);
      this = local_190;
      break;
    case adios2_type_long_double:
      std::__cxx11::string::string((string *)&local_298,name,(allocator *)&arrayStrings);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_29a);
      std::__cxx11::string::string(local_1f0,separator,&local_299);
      pAVar1 = adios2::core::IO::DefineAttribute<long_double>
                         (io,&local_298,data,size,&local_278,local_1f0,0);
      this = local_1f0;
      break;
    default:
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string((string *)&arrayStrings,type);
      std::operator+(&local_278,"ERROR: unsupported type ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &arrayStrings);
      std::operator+(&local_298,&local_278,
                     ", see enum adios2_type for acceptable types, in call to adios2_define_attribute_array or adios2_define_variable_attribute_array\n"
                    );
      std::invalid_argument::invalid_argument(piVar2,(string *)&local_298);
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::string::~string(this);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    return (adios2_attribute *)pAVar1;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&arrayStrings,name,&local_29a);
  std::operator+(&local_278,"ERROR: size of attribute array ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&arrayStrings)
  ;
  std::operator+(&local_298,&local_278,
                 " can\'t be 0,  in call to adios2_define_attribute or adios2_define_variable_attribute"
                );
  std::invalid_argument::invalid_argument(piVar2,(string *)&local_298);
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

adios2_attribute *adios2_define_variable_attribute_array(adios2_io *io, const char *name,
                                                         const adios2_type type, const void *data,
                                                         const size_t size,
                                                         const char *variable_name,
                                                         const char *separator)
{
    adios2_attribute *attribute = nullptr;

    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_define_attribute");

        adios2::helper::CheckForNullptr(data,
                                        "for const void* data, in call to adios2_define_attribute");

        if (size == 0)
        {
            throw std::invalid_argument("ERROR: size of attribute array " + std::string(name) +
                                        " can't be 0,  in call to adios2_define_attribute or "
                                        "adios2_define_variable_attribute");
        }

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        adios2::core::AttributeBase *attributeCpp = nullptr;

        switch (type)
        {
        case (adios2_type_string): {
            const char **char2D = reinterpret_cast<const char **>(const_cast<void *>(data));

            std::vector<std::string> arrayStrings(char2D, char2D + size);

            attributeCpp = &ioCpp.DefineAttribute<std::string>(
                name, arrayStrings.data(), arrayStrings.size(), variable_name, separator);
            break;
        }
#define make_case(adios2_type)                                                                     \
    case (adios2_type): {                                                                          \
        attributeCpp = &ioCpp.DefineAttribute(                                                     \
            name, reinterpret_cast<const MapAdios2Type<adios2_type>::Type *>(data), size,          \
            variable_name, separator);                                                             \
        break;                                                                                     \
    }
            ADIOS2_FOREACH_C_ATTRIBUTE_TYPE_1ARG(make_case)
#undef make_case
        default: {
            throw std::invalid_argument("ERROR: unsupported type " +
                                        std::to_string(static_cast<int>(type)) +
                                        ", see enum adios2_type for acceptable "
                                        "types, in call to "
                                        "adios2_define_attribute_array or "
                                        "adios2_define_variable_attribute_array\n");
        }
        }

        attribute = reinterpret_cast<adios2_attribute *>(attributeCpp);
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_define_attribute_array or "
                                         "adios_define_variable_attribute_array");
    }
    return attribute;
}